

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  uint uVar3;
  unsigned_long i;
  unsigned_long i_00;
  protobuf *this_00;
  string *psVar4;
  uint64 max_value;
  uint64 uVar5;
  uint64 value_1;
  double value;
  LocationRecorder location;
  string local_60;
  protobuf *local_40;
  double local_38;
  LocationRecorder local_30;
  
  if (((field->_has_bits_).has_bits_[0] & 8) != 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Already set option \"default\".","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_60);
    }
    this->had_errors_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    psVar4 = (field->default_value_).ptr_;
    if (psVar4 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      psVar4->_M_string_length = 0;
      *(psVar4->_M_dataplus)._M_p = '\0';
    }
    *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] & 0xf7;
  }
  bVar2 = Consume(this,"default");
  if ((!bVar2) || (bVar2 = Consume(this,"="), !bVar2)) {
    return false;
  }
  LocationRecorder::LocationRecorder(&local_30,field_location,7);
  LocationRecorder::RecordLegacyLocation(&local_30,&field->super_Message,DEFAULT_VALUE);
  uVar3 = (field->_has_bits_).has_bits_[0] | 8;
  (field->_has_bits_).has_bits_[0] = uVar3;
  psVar4 = (field->default_value_).ptr_;
  if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena
              (&field->default_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar4 = (field->default_value_).ptr_;
    uVar3 = (field->_has_bits_).has_bits_[0];
  }
  if ((uVar3 >> 9 & 1) == 0) {
    std::__cxx11::string::_M_assign((string *)psVar4);
    bVar2 = true;
    io::Tokenizer::Next(this->input_);
    goto LAB_002cf9f2;
  }
  switch(field->type_) {
  case 1:
  case 2:
    bVar2 = TryConsume(this,"-");
    if (bVar2) {
      std::__cxx11::string::append((char *)psVar4);
    }
    this_00 = (protobuf *)&local_38;
    bVar2 = ConsumeNumber(this,(double *)this_00,"Expected number.");
    if (!bVar2) goto LAB_002cf9f0;
    SimpleDtoa_abi_cxx11_(&local_60,this_00,local_38);
    std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_60._M_dataplus._M_p);
    break;
  case 3:
  case 0x10:
  case 0x12:
    uVar5 = 0x7fffffffffffffff;
    goto LAB_002cf733;
  case 4:
  case 6:
    uVar5 = 0xffffffffffffffff;
    goto LAB_002cf876;
  case 5:
  case 0xf:
  case 0x11:
    uVar5 = 0x7fffffff;
LAB_002cf733:
    bVar2 = TryConsume(this,"-");
    if (bVar2) {
      std::__cxx11::string::append((char *)psVar4);
      uVar5 = uVar5 + 1;
    }
    bVar2 = ConsumeInteger64(this,uVar5,(uint64 *)&local_40,
                             "Expected integer for field default value.");
    if (!bVar2) {
LAB_002cf9f0:
      bVar2 = false;
      goto LAB_002cf9f2;
    }
    SimpleItoa_abi_cxx11_(&local_60,local_40,i);
    std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_60._M_dataplus._M_p);
    break;
  case 7:
  case 0xd:
    uVar5 = 0xffffffff;
LAB_002cf876:
    bVar2 = TryConsume(this,"-");
    if (bVar2) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Unsigned field can\'t have negative default value.","");
      pEVar1 = this->error_collector_;
      if (pEVar1 != (ErrorCollector *)0x0) {
        (*pEVar1->_vptr_ErrorCollector[2])
                  (pEVar1,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_60);
      }
      this->had_errors_ = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    bVar2 = ConsumeInteger64(this,uVar5,(uint64 *)&local_40,
                             "Expected integer for field default value.");
    if (bVar2) {
      SimpleItoa_abi_cxx11_(&local_60,local_40,i_00);
      std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_60._M_dataplus._M_p);
      break;
    }
    goto LAB_002cf9f0;
  case 8:
    bVar2 = TryConsume(this,"true");
    if ((!bVar2) && (bVar2 = TryConsume(this,"false"), !bVar2)) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Expected \"true\" or \"false\".","");
      pEVar1 = this->error_collector_;
      if (pEVar1 != (ErrorCollector *)0x0) {
        (*pEVar1->_vptr_ErrorCollector[2])
                  (pEVar1,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_60);
      }
      goto LAB_002cf7e7;
    }
    std::__cxx11::string::assign((char *)psVar4);
    goto switchD_002cf71f_default;
  case 9:
    bVar2 = ConsumeString(this,psVar4,"Expected string for field default value.");
    goto LAB_002cf9e8;
  case 10:
  case 0xb:
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Messages can\'t have default values.","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_60);
    }
LAB_002cf7e7:
    this->had_errors_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    goto LAB_002cf9f0;
  case 0xc:
    bVar2 = ConsumeString(this,psVar4,"Expected string.");
    if (!bVar2) goto LAB_002cf9f0;
    CEscape(&local_60,psVar4);
    std::__cxx11::string::operator=((string *)psVar4,(string *)&local_60);
    break;
  case 0xe:
    bVar2 = ConsumeIdentifier(this,psVar4,"Expected enum identifier for field default value.");
LAB_002cf9e8:
    if (bVar2 != false) goto switchD_002cf71f_default;
    goto LAB_002cf9f0;
  default:
    goto switchD_002cf71f_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
switchD_002cf71f_default:
  bVar2 = true;
LAB_002cf9f2:
  LocationRecorder::~LocationRecorder(&local_30);
  return bVar2;
}

Assistant:

bool Parser::ParseDefaultAssignment(
    FieldDescriptorProto* field,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_default_value()) {
    AddError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet. (If it were a primitive type, |field| would have a type set
    // already.) In this case, simply take the current string as the default
    // value; we will catch the error later if it is not a valid enum value.
    // (N.B. that we do not check whether the current token is an identifier:
    // doing so throws strange errors when the user mistypes a primitive
    // typename and we assume it's an enum. E.g.: "optional int foo = 1 [default
    // = 42]". In such a case the fundamental error is really that "int" is not
    // a type, not that "42" is not an identifier. See b/12533582.)
    *default_value = input_->current().text;
    input_->Next();
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64 max_value = kint64max;
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = kint32max;
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64 max_value = kuint64max;
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = kuint32max;
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        AddError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE:
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(SimpleDtoa(value));
      break;

    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        AddError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      // Note: When file opton java_string_check_utf8 is true, if a
      // non-string representation (eg byte[]) is later supported, it must
      // be checked for UTF-8-ness.
      DO(ConsumeString(default_value, "Expected string for field default "
                       "value."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value, "Expected enum identifier for field "
                                          "default value."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      AddError("Messages can't have default values.");
      return false;
  }

  return true;
}